

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator_factory.hpp
# Opt level: O2

unique_ptr<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::make_not_validator
          (keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent,
          anchor_uri_map_type *anchor_dict)

{
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  keys;
  allocator<char> local_131;
  undefined1 local_130 [8];
  string not_key [1];
  uri schema_location;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)not_key,"not",(allocator<char> *)&stack0xffffffffffffff00);
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  make_schema_location
            (&schema_location,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)sch,not_key);
  std::__cxx11::string::~string((string *)not_key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)not_key,"not",(allocator<char> *)&stack0xffffffffffffff00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff20,"not",&local_131);
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  get_custom_message((string *)&stack0xffffffffffffff00,
                     (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)sch,(string *)&stack0xffffffffffffff20);
  keys.size_ = (size_type)not_key;
  keys.data_ = (pointer)parent;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  ::make_cross_draft_schema_validator
            ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)local_130,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)(context->base_uri_).uri_.uri_string_._M_dataplus._M_p,sch,keys,
             (anchor_uri_map_type *)0x1);
  std::
  make_unique<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
             (uri *)anchor_dict,&schema_location.uri_string_,
             (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)&stack0xffffffffffffff00);
  if (local_130 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_130 + 8))();
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::__cxx11::string::~string((string *)not_key);
  std::__cxx11::string::~string((string *)&schema_location);
  return (__uniq_ptr_data<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_data<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<not_validator<Json>> make_not_validator(const compilation_context<Json>& context, 
            const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict)
        {
            uri schema_location = context.make_schema_location("not");
            std::string not_key[] = { "not" };
            return jsoncons::make_unique<not_validator<Json>>(parent, schema_location, context.get_custom_message("not"), 
                factory_->make_cross_draft_schema_validator(context, sch, not_key, anchor_dict));
        }